

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O2

int anon_unknown.dwarf_e67a::CheckHeader(FILE *fp,char *text)

{
  int iVar1;
  char data_check [5];
  
  fread(data_check,1,4,(FILE *)fp);
  data_check[4] = '\0';
  iVar1 = strcmp(data_check,text);
  if (iVar1 != 0) {
    puts("Header error.");
    fclose((FILE *)fp);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int CheckHeader(FILE *fp, const char *text) {
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "F0  "
  data_check[4] = '\0';
  if (0 != strcmp(data_check, text)) {
    printf("Header error.\n");
    fclose(fp);
    return 0;
  }
  return 1;
}